

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3RunVacuum(char **pzErrMsg,sqlite3 *db,int iDb,sqlite3_value *pOut)

{
  u16 *puVar1;
  u8 uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  Btree *p;
  Pager *pPVar6;
  Btree *p_00;
  sqlite3_file *psVar7;
  sqlite3_io_methods *psVar8;
  BtShared *pBVar9;
  i64 iVar10;
  i64 iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Db *pDVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  uchar *local_110;
  Db *local_f8;
  u32 meta;
  undefined1 *local_c8;
  long local_c0;
  i64 sz;
  Btree *pBStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  sqlite3 *local_98;
  Btree *pBStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  sqlite3_backup *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined2 uStack_50;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined1 *puStack_46;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (db->autoCommit == '\0') {
    pcVar17 = "cannot VACUUM from within a transaction";
  }
  else {
    if (db->nVdbeActive < 2) {
      uVar18 = db->openFlags;
      if (pOut == (sqlite3_value *)0x0) {
        local_110 = "";
      }
      else {
        uVar4._0_2_ = pOut->flags;
        uVar4._2_1_ = pOut->enc;
        uVar4._3_1_ = pOut->eSubtype;
        if ((0x4000000040004U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          pcVar17 = "non-text filename";
          goto LAB_0014bbb6;
        }
        local_110 = sqlite3_value_text(pOut);
        db->openFlags = db->openFlags & 0xfffffff8 | 6;
      }
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = 0xaaaa;
      uStack_4e = 0xaaaaaaaaaaaa;
      uStack_48 = 0xaaaa;
      puStack_46 = &DAT_aaaaaaaaaaaaaaaa;
      uVar5 = db->flags;
      uVar4 = db->mDbFlags;
      iVar10 = db->nChange;
      iVar11 = db->nTotalChange;
      uVar2 = db->mTrace;
      db->mDbFlags = uVar4 | 6;
      db->flags = uVar5 & 0xfffffffeefffadfe | 0x201;
      db->mTrace = '\0';
      p = db->aDb[iDb].pBt;
      pPVar6 = p->pBt->pPager;
      if (pPVar6->tempFile == '\0') {
        bVar20 = pPVar6->memVfs == '\0';
      }
      else {
        bVar20 = false;
      }
      pcVar17 = db->aDb[iDb].zDbSName;
      sqlite3_randomness(8,&local_c8);
      local_f8 = (Db *)0x0;
      sqlite3_snprintf(0x2a,(char *)&local_68,"vacuum_%016llx",local_c8);
      iVar15 = db->nDb;
      iVar12 = execSqlF(db,pzErrMsg,"ATTACH %Q AS %s",local_110,&local_68);
      db->openFlags = uVar18;
      if (iVar12 == 0) {
        pDVar16 = db->aDb;
        local_f8 = pDVar16 + iVar15;
        p_00 = pDVar16[iVar15].pBt;
        if (pOut == (sqlite3_value *)0x0) {
          uVar18 = 0x21;
        }
        else {
          psVar7 = p_00->pBt->pPager->fd;
          sz = 0;
          psVar8 = psVar7->pMethods;
          if (psVar8 != (sqlite3_io_methods *)0x0) {
            iVar12 = (*psVar8->xFileSize)(psVar7,&sz);
            if ((iVar12 != 0) || (0 < sz)) {
              sqlite3SetString(pzErrMsg,db,"output file already exists");
              iVar12 = 1;
              goto LAB_0014be9d;
            }
            pDVar16 = db->aDb;
          }
          *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 8;
          uVar18 = (uint)db->flags & 0x18 | (uint)pDVar16[iDb].safety_level | 0x20;
        }
        iVar13 = sqlite3BtreeGetRequestedReserve(p);
        sqlite3BtreeSetCacheSize(p_00,(db->aDb[iDb].pSchema)->cache_size);
        iVar12 = sqlite3BtreeSetSpillSize(p,0);
        sqlite3BtreeSetSpillSize(p_00,iVar12);
        sqlite3BtreeSetPagerFlags(p_00,uVar18);
        iVar12 = execSql(db,pzErrMsg,"BEGIN");
        if ((iVar12 == 0) &&
           (iVar12 = sqlite3BtreeBeginTrans(p,(uint)(pOut == (sqlite3_value *)0x0) * 2,(int *)0x0),
           iVar12 == 0)) {
          pBVar9 = p->pBt;
          if ((pOut == (sqlite3_value *)0x0) && (pBVar9->pPager->journalMode == '\x05')) {
            db->nextPagesize = 0;
          }
          iVar14 = sqlite3BtreeSetPageSize(p_00,pBVar9->pageSize,iVar13,0);
          iVar12 = 7;
          if ((iVar14 == 0) &&
             (((!bVar20 ||
               (iVar13 = sqlite3BtreeSetPageSize(p_00,db->nextPagesize,iVar13,0), iVar13 == 0)) &&
              (db->mallocFailed == '\0')))) {
            iVar12 = (int)db->nextAutovac;
            if (db->nextAutovac < '\0') {
              iVar12 = sqlite3BtreeGetAutoVacuum(p);
            }
            sqlite3BtreeSetAutoVacuum(p_00,iVar12);
            (db->init).iDb = (u8)iVar15;
            iVar12 = execSqlF(db,pzErrMsg,
                              "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'table\'AND name<>\'sqlite_sequence\' AND coalesce(rootpage,1)>0"
                              ,pcVar17);
            if ((iVar12 == 0) &&
               (iVar12 = execSqlF(db,pzErrMsg,
                                  "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'index\'",
                                  pcVar17), iVar12 == 0)) {
              (db->init).iDb = '\0';
              iVar12 = execSqlF(db,pzErrMsg,
                                "SELECT\'INSERT INTO %s.\'||quote(name)||\' SELECT*FROM\"%w\".\'||quote(name)FROM %s.sqlite_schema WHERE type=\'table\'AND coalesce(rootpage,1)>0"
                                ,&local_68,pcVar17,&local_68);
              *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfb;
              if ((iVar12 == 0) &&
                 (iVar12 = execSqlF(db,pzErrMsg,
                                    "INSERT INTO %s.sqlite_schema SELECT*FROM \"%w\".sqlite_schema WHERE type IN(\'view\',\'trigger\') OR(type=\'table\'AND rootpage=0)"
                                    ,&local_68,pcVar17), iVar12 == 0)) {
                meta = 0xaaaaaaaa;
                uVar19 = 0;
                do {
                  if (9 < uVar19) {
                    if (pOut == (sqlite3_value *)0x0) {
                      local_78 = (sqlite3_backup *)&DAT_aaaaaaaaaaaaaaaa;
                      local_88 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
                      local_98 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
                      pBStack_90 = (Btree *)&DAT_aaaaaaaaaaaaaaaa;
                      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
                      sz = (i64)&DAT_aaaaaaaaaaaaaaaa;
                      pBStack_b0 = (Btree *)&DAT_aaaaaaaaaaaaaaaa;
                      sqlite3BtreeEnter(p);
                      sqlite3BtreeEnter(p_00);
                      psVar7 = p->pBt->pPager->fd;
                      psVar8 = psVar7->pMethods;
                      if (psVar8 == (sqlite3_io_methods *)0x0) {
LAB_0014c144:
                        local_88 = (undefined1 *)0x0;
                        puStack_80 = (undefined1 *)0x0;
                        local_a8 = (undefined1 *)0x0;
                        sz = 0;
                        local_78 = (sqlite3_backup *)0x0;
                        local_98 = p_00->db;
                        puStack_a0 = (undefined1 *)0x1;
                        pBStack_b0 = p;
                        pBStack_90 = p_00;
                        sqlite3_backup_step((sqlite3_backup *)&sz,0x7fffffff);
                        iVar12 = sqlite3_backup_finish((sqlite3_backup *)&sz);
                        if (iVar12 == 0) {
                          puVar1 = &p->pBt->btsFlags;
                          *puVar1 = *puVar1 & 0xfffd;
                          iVar12 = 0;
                        }
                        else {
                          sqlite3PagerClearCache(pBStack_b0->pBt->pPager);
                        }
                      }
                      else {
                        local_c0 = (ulong)p_00->pBt->nPage * (long)(int)p_00->pBt->pageSize;
                        iVar12 = (*psVar8->xFileControl)(psVar7,0xb,&local_c0);
                        if ((iVar12 == 0xc) || (iVar12 == 0)) goto LAB_0014c144;
                      }
                      sqlite3BtreeLeave(p_00);
                      sqlite3BtreeLeave(p);
                      if (iVar12 != 0) break;
                    }
                    iVar12 = sqlite3BtreeCommit(p_00);
                    bVar20 = iVar12 == 0;
                    if ((pOut == (sqlite3_value *)0x0) && (iVar12 == 0)) {
                      iVar15 = sqlite3BtreeGetAutoVacuum(p_00);
                      sqlite3BtreeSetAutoVacuum(p,iVar15);
                      bVar20 = true;
                    }
                    if ((pOut == (sqlite3_value *)0x0) && (bVar20)) {
                      iVar15 = sqlite3BtreeGetRequestedReserve(p_00);
                      iVar12 = sqlite3BtreeSetPageSize(p,p_00->pBt->pageSize,iVar15,1);
                    }
                    break;
                  }
                  bVar3 = "\x01\x01\x03"[uVar19];
                  sqlite3BtreeGetMeta(p,(uint)bVar3,&meta);
                  iVar12 = sqlite3BtreeUpdateMeta
                                     (p_00,(uint)bVar3,"\x01\x01\x03"[uVar19 + 1] + meta);
                  uVar19 = uVar19 + 2;
                } while (iVar12 == 0);
              }
            }
          }
        }
      }
LAB_0014be9d:
      (db->init).iDb = '\0';
      db->mDbFlags = uVar4;
      db->flags = uVar5;
      db->nChange = iVar10;
      db->nTotalChange = iVar11;
      db->mTrace = uVar2;
      sqlite3BtreeSetPageSize(p,-1,0,1);
      db->autoCommit = '\x01';
      if (local_f8 != (Db *)0x0) {
        sqlite3BtreeClose(local_f8->pBt);
        local_f8->pBt = (Btree *)0x0;
        local_f8->pSchema = (Schema *)0x0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      goto LAB_0014befd;
    }
    pcVar17 = "cannot VACUUM - SQL statements in progress";
  }
LAB_0014bbb6:
  sqlite3SetString(pzErrMsg,db,pcVar17);
  iVar12 = 1;
LAB_0014befd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

int sqlite3RunVacuum(
  char **pzErrMsg,        /* Write error message here */
  sqlite3 *db,            /* Database connection */
  int iDb,                /* Which attached DB to vacuum */
  sqlite3_value *pOut     /* Write results here, if not NULL. VACUUM INTO */
){
  int rc = SQLITE_OK;     /* Return code from service routines */
  Btree *pMain;           /* The database being vacuumed */
  Btree *pTemp;           /* The temporary database we vacuum into */
  u32 saved_mDbFlags;     /* Saved value of db->mDbFlags */
  u64 saved_flags;        /* Saved value of db->flags */
  i64 saved_nChange;      /* Saved value of db->nChange */
  i64 saved_nTotalChange; /* Saved value of db->nTotalChange */
  u32 saved_openFlags;    /* Saved value of db->openFlags */
  u8 saved_mTrace;        /* Saved trace settings */
  Db *pDb = 0;            /* Database to detach at end of vacuum */
  int isMemDb;            /* True if vacuuming a :memory: database */
  int nRes;               /* Bytes of reserved space at the end of each page */
  int nDb;                /* Number of attached databases */
  const char *zDbMain;    /* Schema name of database to vacuum */
  const char *zOut;       /* Name of output file */
  u32 pgflags = PAGER_SYNCHRONOUS_OFF; /* sync flags for output db */
  u64 iRandom;            /* Random value used for zDbVacuum[] */
  char zDbVacuum[42];     /* Name of the ATTACH-ed database used for vacuum */


  if( !db->autoCommit ){
    sqlite3SetString(pzErrMsg, db, "cannot VACUUM from within a transaction");
    return SQLITE_ERROR; /* IMP: R-12218-18073 */
  }
  if( db->nVdbeActive>1 ){
    sqlite3SetString(pzErrMsg, db,"cannot VACUUM - SQL statements in progress");
    return SQLITE_ERROR; /* IMP: R-15610-35227 */
  }
  saved_openFlags = db->openFlags;
  if( pOut ){
    if( sqlite3_value_type(pOut)!=SQLITE_TEXT ){
      sqlite3SetString(pzErrMsg, db, "non-text filename");
      return SQLITE_ERROR;
    }
    zOut = (const char*)sqlite3_value_text(pOut);
    db->openFlags &= ~SQLITE_OPEN_READONLY;
    db->openFlags |= SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE;
  }else{
    zOut = "";
  }

  /* Save the current value of the database flags so that it can be
  ** restored before returning. Then set the writable-schema flag, and
  ** disable CHECK and foreign key constraints.  */
  saved_flags = db->flags;
  saved_mDbFlags = db->mDbFlags;
  saved_nChange = db->nChange;
  saved_nTotalChange = db->nTotalChange;
  saved_mTrace = db->mTrace;
  db->flags |= SQLITE_WriteSchema | SQLITE_IgnoreChecks;
  db->mDbFlags |= DBFLAG_PreferBuiltin | DBFLAG_Vacuum;
  db->flags &= ~(u64)(SQLITE_ForeignKeys | SQLITE_ReverseOrder
                   | SQLITE_Defensive | SQLITE_CountRows);
  db->mTrace = 0;

  zDbMain = db->aDb[iDb].zDbSName;
  pMain = db->aDb[iDb].pBt;
  isMemDb = sqlite3PagerIsMemdb(sqlite3BtreePager(pMain));

  /* Attach the temporary database as 'vacuum_XXXXXX'. The synchronous pragma
  ** can be set to 'off' for this file, as it is not recovered if a crash
  ** occurs anyway. The integrity of the database is maintained by a
  ** (possibly synchronous) transaction opened on the main database before
  ** sqlite3BtreeCopyFile() is called.
  **
  ** An optimization would be to use a non-journaled pager.
  ** (Later:) I tried setting "PRAGMA vacuum_XXXXXX.journal_mode=OFF" but
  ** that actually made the VACUUM run slower.  Very little journalling
  ** actually occurs when doing a vacuum since the vacuum_db is initially
  ** empty.  Only the journal header is written.  Apparently it takes more
  ** time to parse and run the PRAGMA to turn journalling off than it does
  ** to write the journal header file.
  */
  sqlite3_randomness(sizeof(iRandom),&iRandom);
  sqlite3_snprintf(sizeof(zDbVacuum), zDbVacuum, "vacuum_%016llx", iRandom);
  nDb = db->nDb;
  rc = execSqlF(db, pzErrMsg, "ATTACH %Q AS %s", zOut, zDbVacuum);
  db->openFlags = saved_openFlags;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  assert( (db->nDb-1)==nDb );
  pDb = &db->aDb[nDb];
  assert( strcmp(pDb->zDbSName,zDbVacuum)==0 );
  pTemp = pDb->pBt;
  if( pOut ){
    sqlite3_file *id = sqlite3PagerFile(sqlite3BtreePager(pTemp));
    i64 sz = 0;
    if( id->pMethods!=0 && (sqlite3OsFileSize(id, &sz)!=SQLITE_OK || sz>0) ){
      rc = SQLITE_ERROR;
      sqlite3SetString(pzErrMsg, db, "output file already exists");
      goto end_of_vacuum;
    }
    db->mDbFlags |= DBFLAG_VacuumInto;

    /* For a VACUUM INTO, the pager-flags are set to the same values as
    ** they are for the database being vacuumed, except that PAGER_CACHESPILL
    ** is always set. */
    pgflags = db->aDb[iDb].safety_level | (db->flags & PAGER_FLAGS_MASK);
  }
  nRes = sqlite3BtreeGetRequestedReserve(pMain);

  sqlite3BtreeSetCacheSize(pTemp, db->aDb[iDb].pSchema->cache_size);
  sqlite3BtreeSetSpillSize(pTemp, sqlite3BtreeSetSpillSize(pMain,0));
  sqlite3BtreeSetPagerFlags(pTemp, pgflags|PAGER_CACHESPILL);

  /* Begin a transaction and take an exclusive lock on the main database
  ** file. This is done before the sqlite3BtreeGetPageSize(pMain) call below,
  ** to ensure that we do not try to change the page-size on a WAL database.
  */
  rc = execSql(db, pzErrMsg, "BEGIN");
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = sqlite3BtreeBeginTrans(pMain, pOut==0 ? 2 : 0, 0);
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Do not attempt to change the page size for a WAL database */
  if( sqlite3PagerGetJournalMode(sqlite3BtreePager(pMain))
                                               ==PAGER_JOURNALMODE_WAL
   && pOut==0
  ){
    db->nextPagesize = 0;
  }

  if( sqlite3BtreeSetPageSize(pTemp, sqlite3BtreeGetPageSize(pMain), nRes, 0)
   || (!isMemDb && sqlite3BtreeSetPageSize(pTemp, db->nextPagesize, nRes, 0))
   || NEVER(db->mallocFailed)
  ){
    rc = SQLITE_NOMEM_BKPT;
    goto end_of_vacuum;
  }

#ifndef SQLITE_OMIT_AUTOVACUUM
  sqlite3BtreeSetAutoVacuum(pTemp, db->nextAutovac>=0 ? db->nextAutovac :
                                           sqlite3BtreeGetAutoVacuum(pMain));
#endif

  /* Query the schema of the main database. Create a mirror schema
  ** in the temporary database.
  */
  db->init.iDb = nDb; /* force new CREATE statements into vacuum_db */
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='table'AND name<>'sqlite_sequence'"
      " AND coalesce(rootpage,1)>0",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='index'",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  db->init.iDb = 0;

  /* Loop through the tables in the main database. For each, do
  ** an "INSERT INTO vacuum_db.xxx SELECT * FROM main.xxx;" to copy
  ** the contents to the temporary database.
  */
  rc = execSqlF(db, pzErrMsg,
      "SELECT'INSERT INTO %s.'||quote(name)"
      "||' SELECT*FROM\"%w\".'||quote(name)"
      "FROM %s.sqlite_schema "
      "WHERE type='table'AND coalesce(rootpage,1)>0",
      zDbVacuum, zDbMain, zDbVacuum
  );
  assert( (db->mDbFlags & DBFLAG_Vacuum)!=0 );
  db->mDbFlags &= ~DBFLAG_Vacuum;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Copy the triggers, views, and virtual tables from the main database
  ** over to the temporary database.  None of these objects has any
  ** associated storage, so all we have to do is copy their entries
  ** from the schema table.
  */
  rc = execSqlF(db, pzErrMsg,
      "INSERT INTO %s.sqlite_schema"
      " SELECT*FROM \"%w\".sqlite_schema"
      " WHERE type IN('view','trigger')"
      " OR(type='table'AND rootpage=0)",
      zDbVacuum, zDbMain
  );
  if( rc ) goto end_of_vacuum;

  /* At this point, there is a write transaction open on both the
  ** vacuum database and the main database. Assuming no error occurs,
  ** both transactions are closed by this block - the main database
  ** transaction by sqlite3BtreeCopyFile() and the other by an explicit
  ** call to sqlite3BtreeCommit().
  */
  {
    u32 meta;
    int i;

    /* This array determines which meta meta values are preserved in the
    ** vacuum.  Even entries are the meta value number and odd entries
    ** are an increment to apply to the meta value after the vacuum.
    ** The increment is used to increase the schema cookie so that other
    ** connections to the same database will know to reread the schema.
    */
    static const unsigned char aCopy[] = {
       BTREE_SCHEMA_VERSION,     1,  /* Add one to the old schema cookie */
       BTREE_DEFAULT_CACHE_SIZE, 0,  /* Preserve the default page cache size */
       BTREE_TEXT_ENCODING,      0,  /* Preserve the text encoding */
       BTREE_USER_VERSION,       0,  /* Preserve the user version */
       BTREE_APPLICATION_ID,     0,  /* Preserve the application id */
    };

    assert( SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pTemp) );
    assert( pOut!=0 || SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pMain) );

    /* Copy Btree meta values */
    for(i=0; i<ArraySize(aCopy); i+=2){
      /* GetMeta() and UpdateMeta() cannot fail in this context because
      ** we already have page 1 loaded into cache and marked dirty. */
      sqlite3BtreeGetMeta(pMain, aCopy[i], &meta);
      rc = sqlite3BtreeUpdateMeta(pTemp, aCopy[i], meta+aCopy[i+1]);
      if( NEVER(rc!=SQLITE_OK) ) goto end_of_vacuum;
    }

    if( pOut==0 ){
      rc = sqlite3BtreeCopyFile(pMain, pTemp);
    }
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
    rc = sqlite3BtreeCommit(pTemp);
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pOut==0 ){
      sqlite3BtreeSetAutoVacuum(pMain, sqlite3BtreeGetAutoVacuum(pTemp));
    }
#endif
  }

  assert( rc==SQLITE_OK );
  if( pOut==0 ){
    nRes = sqlite3BtreeGetRequestedReserve(pTemp);
    rc = sqlite3BtreeSetPageSize(pMain, sqlite3BtreeGetPageSize(pTemp), nRes,1);
  }

end_of_vacuum:
  /* Restore the original value of db->flags */
  db->init.iDb = 0;
  db->mDbFlags = saved_mDbFlags;
  db->flags = saved_flags;
  db->nChange = saved_nChange;
  db->nTotalChange = saved_nTotalChange;
  db->mTrace = saved_mTrace;
  sqlite3BtreeSetPageSize(pMain, -1, 0, 1);

  /* Currently there is an SQL level transaction open on the vacuum
  ** database. No locks are held on any other files (since the main file
  ** was committed at the btree level). So it safe to end the transaction
  ** by manually setting the autoCommit flag to true and detaching the
  ** vacuum database. The vacuum_db journal file is deleted when the pager
  ** is closed by the DETACH.
  */
  db->autoCommit = 1;

  if( pDb ){
    sqlite3BtreeClose(pDb->pBt);
    pDb->pBt = 0;
    pDb->pSchema = 0;
  }

  /* This both clears the schemas and reduces the size of the db->aDb[]
  ** array. */
  sqlite3ResetAllSchemasOfConnection(db);

  return rc;
}